

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O2

exr_result_t unpack_half_to_float_3chan_interleave_rev(exr_decode_pipeline_t *decode)

{
  uint uVar1;
  int iVar2;
  exr_coding_channel_info_t *peVar3;
  ulong uVar4;
  int iVar5;
  uint16_t *puVar6;
  uint16_t *puVar7;
  long lVar8;
  uint8_t *puVar9;
  long lVar10;
  int iVar11;
  float fVar12;
  
  puVar6 = (uint16_t *)decode->unpacked_buffer;
  peVar3 = decode->channels;
  uVar1 = peVar3->width;
  lVar10 = (long)(int)uVar1;
  iVar5 = (decode->chunk).height;
  iVar2 = peVar3->user_line_stride;
  puVar9 = peVar3[2].field_12.decode_to_ptr;
  iVar11 = 0;
  uVar4 = 0;
  if (0 < (int)uVar1) {
    uVar4 = (ulong)uVar1;
  }
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  for (; iVar11 != iVar5; iVar11 = iVar11 + 1) {
    puVar7 = puVar6;
    for (lVar8 = 0; uVar4 * 6 - lVar8 != 0; lVar8 = lVar8 + 6) {
      fVar12 = half_to_float(puVar7[lVar10 * 2]);
      *(float *)(puVar9 + lVar8 * 2) = fVar12;
      fVar12 = half_to_float(puVar7[lVar10]);
      *(float *)(puVar9 + lVar8 * 2 + 4) = fVar12;
      fVar12 = half_to_float(*puVar7);
      *(float *)(puVar9 + lVar8 * 2 + 8) = fVar12;
      puVar7 = puVar7 + 1;
    }
    puVar6 = puVar6 + lVar10 * 3;
    puVar9 = puVar9 + iVar2;
  }
  return 0;
}

Assistant:

static exr_result_t
unpack_half_to_float_3chan_interleave_rev (exr_decode_pipeline_t* decode)
{
    /* we know we're unpacking all the channels and there is no subsampling */
    const uint8_t*  srcbuffer = (const uint8_t*) decode->unpacked_buffer;
    const uint16_t *in0, *in1, *in2;
    uint8_t*        out0;
    int             w, h;
    int             linc0;

    w     = decode->channels[0].width;
    h     = decode->chunk.height;
    linc0 = decode->channels[0].user_line_stride;

    out0 = decode->channels[2].decode_to_ptr;

    /* interleaving case, we can do this! */
    for (int y = 0; y < h; ++y)
    {
        float* out = (float*) out0;

        in0 = (const uint16_t*) srcbuffer;
        in1 = in0 + w;
        in2 = in1 + w;

        srcbuffer += w * 6; // 3 * sizeof(uint16_t), avoid type conversion
        for (int x = 0; x < w; ++x)
        {
            out[0] = half_to_float (one_to_native16 (in2[x]));
            out[1] = half_to_float (one_to_native16 (in1[x]));
            out[2] = half_to_float (one_to_native16 (in0[x]));
            out += 3;
        }
        out0 += linc0;
    }
    return EXR_ERR_SUCCESS;
}